

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

EncryptionWithColumnKey * __thiscall
duckdb_parquet::EncryptionWithColumnKey::operator=
          (EncryptionWithColumnKey *this,EncryptionWithColumnKey *other135)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->path_in_schema,
              &(other135->path_in_schema).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  std::__cxx11::string::_M_assign((string *)&this->key_metadata);
  this->__isset = other135->__isset;
  return this;
}

Assistant:

EncryptionWithColumnKey& EncryptionWithColumnKey::operator=(const EncryptionWithColumnKey& other135) {
  path_in_schema = other135.path_in_schema;
  key_metadata = other135.key_metadata;
  __isset = other135.__isset;
  return *this;
}